

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

QAbstractItemView * __thiscall
QColumnViewPrivate::createColumn(QColumnViewPrivate *this,QModelIndex *index,bool show)

{
  QWidget *pQVar1;
  QAbstractItemModel *pQVar2;
  ulong uVar3;
  QWidgetData *pQVar4;
  QAbstractItemView *pQVar5;
  Connection CVar6;
  char cVar7;
  bool bVar8;
  Representation w;
  int aw;
  QWidget *pQVar9;
  QSize QVar10;
  QSize QVar11;
  vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>> *pvVar12;
  pointer piVar13;
  long lVar14;
  int ax;
  ulong size;
  ConnectionType type;
  long in_FS_OFFSET;
  code *local_88;
  undefined8 local_80;
  Connection clickedConnection;
  QWidget *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  QWidgetData *local_38;
  
  local_38 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QWidget **)
            &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
             super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  clickedConnection.d_ptr = &DAT_aaaaaaaaaaaaaaaa;
  QMetaObject::Connection::Connection(&clickedConnection);
  pQVar2 = (this->super_QAbstractItemViewPrivate).model;
  cVar7 = (**(code **)(*(long *)pQVar2 + 0x88))(pQVar2,index);
  if (cVar7 == '\0') {
    pQVar9 = (QWidget *)this->previewColumn;
    if (pQVar9 == (QWidget *)0x0) {
      pQVar9 = (QWidget *)operator_new(0x28);
      QWidget::QWidget(pQVar9,pQVar1,(WindowFlags)0x0);
      setPreviewWidget(this,pQVar9);
      pQVar9 = (QWidget *)this->previewColumn;
    }
    local_70 = pQVar9;
    QVar10 = QWidget::minimumSize(pQVar9);
    QVar11 = QWidget::minimumSize(this->previewWidget);
    w.m_i = QVar10.wd.m_i.m_i;
    if (QVar10.wd.m_i.m_i <= QVar11.wd.m_i.m_i) {
      w.m_i = QVar11.wd.m_i.m_i;
    }
    QWidget::setMinimumWidth(pQVar9,w.m_i);
  }
  else {
    pQVar9 = (QWidget *)(**(code **)(*(long *)pQVar1 + 0x300))(pQVar1,index);
    local_68._0_8_ = clicked;
    local_68._8_8_ = 0;
    local_70 = pQVar9;
    QObjectPrivate::
    connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QColumnViewPrivate::*)(QModelIndex_const&)>
              ((Object *)&local_88,(offset_in_QAbstractItemView_to_subr)pQVar9,
               (Object *)QAbstractItemView::clicked,0,(ConnectionType)this);
    CVar6 = clickedConnection;
    clickedConnection.d_ptr = local_88;
    local_88 = (code *)CVar6.d_ptr;
    QMetaObject::Connection::~Connection((Connection *)&local_88);
  }
  lVar14 = 0x28;
  local_88 = QAbstractItemView::activated;
  local_80 = 0;
  type = (ConnectionType)pQVar1;
  QObject::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&)>
            ((Object *)local_68,(offset_in_QAbstractItemView_to_subr)pQVar9,
             (ContextType *)QAbstractItemView::activated,(offset_in_QAbstractItemView_to_subr *)0x0,
             type);
  pQVar9 = local_70;
  QObject::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&)>
            ((Object *)(local_68 + 8),(offset_in_QAbstractItemView_to_subr)local_70,
             (ContextType *)QAbstractItemView::clicked,(offset_in_QAbstractItemView_to_subr *)0x0,
             type);
  QObject::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&)>
            ((Object *)local_58,(offset_in_QAbstractItemView_to_subr)pQVar9,
             (ContextType *)QAbstractItemView::doubleClicked,
             (offset_in_QAbstractItemView_to_subr *)0x0,type);
  QObject::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&)>
            ((Object *)(local_58 + 8),(offset_in_QAbstractItemView_to_subr)pQVar9,
             (ContextType *)QAbstractItemView::entered,(offset_in_QAbstractItemView_to_subr *)0x0,
             type);
  QObject::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&)>
            ((Object *)(local_58 + 0x10),(offset_in_QAbstractItemView_to_subr)pQVar9,
             (ContextType *)QAbstractItemView::pressed,(offset_in_QAbstractItemView_to_subr *)0x0,
             type);
  QMetaObject::Connection::Connection((Connection *)(local_58 + 0x18),&clickedConnection);
  pvVar12 = (vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>> *)
            QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
            ::operator[](&this->viewConnections,(QAbstractItemView **)&local_70);
  std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>::
  _M_assign_aux<QMetaObject::Connection_const*>(pvVar12,(Object *)local_68,&local_38);
  do {
    QMetaObject::Connection::~Connection((Connection *)(local_68 + lVar14));
    lVar14 = lVar14 + -8;
  } while (lVar14 != -8);
  QWidget::setFocusPolicy(local_70,NoFocus);
  QWidget::setParent(local_70,(this->super_QAbstractItemViewPrivate).
                              super_QAbstractScrollAreaPrivate.viewport);
  if (this->showResizeGrips == true) {
    pQVar9 = (QWidget *)operator_new(0x28);
    QColumnViewGrip::QColumnViewGrip((QColumnViewGrip *)pQVar9,local_70);
    QAbstractScrollArea::setCornerWidget((QAbstractScrollArea *)local_70,pQVar9);
    local_68._0_8_ = gripMoved;
    local_68._8_8_ = 0;
    QObjectPrivate::connect<void(QColumnViewGrip::*)(int),void(QColumnViewPrivate::*)(int)>
              ((Object *)&local_88,(offset_in_QColumnViewGrip_to_subr)pQVar9,
               (Object *)QColumnViewGrip::gripMoved,0,(ConnectionType)this);
    std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::
    emplace_back<QMetaObject::Connection>(&this->gripConnections,(Connection *)&local_88);
    QMetaObject::Connection::~Connection((Connection *)&local_88);
  }
  uVar3 = (this->columns).d.size;
  if (uVar3 < (ulong)(this->columnSizes).d.size) {
    pQVar4 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    QWidget::setGeometry
              (local_70,0,0,(this->columnSizes).d.ptr[uVar3],
               ((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i) + 1);
  }
  else {
    aw = (**(code **)(*(long *)local_70 + 0x70))();
    bVar8 = QWidget::isRightToLeft(pQVar1);
    pQVar4 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    ax = 0;
    if (bVar8) {
      ax = ((pQVar4->crect).x2.m_i - ((pQVar4->crect).x1.m_i + aw)) + 1;
    }
    QWidget::setGeometry(local_70,ax,0,aw,((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i) + 1);
    uVar3 = (this->columnSizes).d.size;
    size = (this->columns).d.size + 1;
    if (size < uVar3) {
      size = uVar3;
    }
    QList<int>::resize(&this->columnSizes,size);
    lVar14 = (this->columns).d.size;
    piVar13 = QList<int>::data(&this->columnSizes);
    piVar13[lVar14] = aw;
  }
  lVar14 = (this->columns).d.size;
  if (lVar14 != 0) {
    pQVar5 = (this->columns).d.ptr[lVar14 + -1];
    if ((((pQVar5->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->widget_attributes &
        0x10000) != 0) {
      (**(code **)(*(long *)&(pQVar5->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x68))
                (pQVar5,1);
    }
  }
  QList<QAbstractItemView_*>::append(&this->columns,(parameter_type)local_70);
  doLayout(this);
  updateScrollbars(this);
  if ((show) && ((local_70->data->widget_attributes & 0x10000) != 0)) {
    (**(code **)(*(long *)local_70 + 0x68))(local_70,1);
  }
  pQVar1 = local_70;
  QMetaObject::Connection::~Connection(&clickedConnection);
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
    return (QAbstractItemView *)pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractItemView *QColumnViewPrivate::createColumn(const QModelIndex &index, bool show)
{
    Q_Q(QColumnView);
    QAbstractItemView *view = nullptr;
    QMetaObject::Connection clickedConnection;
    if (model->hasChildren(index)) {
        view = q->createColumn(index);
        clickedConnection = QObjectPrivate::connect(view, &QAbstractItemView::clicked,
                                                    this, &QColumnViewPrivate::clicked);
    } else {
        if (!previewColumn)
            setPreviewWidget(new QWidget(q));
        view = previewColumn;
        view->setMinimumWidth(qMax(view->minimumWidth(), previewWidget->minimumWidth()));
    }

    viewConnections[view] = {
        QObject::connect(view, &QAbstractItemView::activated, q, &QColumnView::activated),
        QObject::connect(view, &QAbstractItemView::clicked, q, &QColumnView::clicked),
        QObject::connect(view, &QAbstractItemView::doubleClicked, q, &QColumnView::doubleClicked),
        QObject::connect(view, &QAbstractItemView::entered, q, &QColumnView::entered),
        QObject::connect(view, &QAbstractItemView::pressed, q, &QColumnView::pressed),
        clickedConnection
    };

    view->setFocusPolicy(Qt::NoFocus);
    view->setParent(viewport);
    Q_ASSERT(view);

    // Setup corner grip
    if (showResizeGrips) {
        QColumnViewGrip *grip = new QColumnViewGrip(view);
        view->setCornerWidget(grip);
        gripConnections.push_back(
            QObjectPrivate::connect(grip, &QColumnViewGrip::gripMoved,
                                    this, &QColumnViewPrivate::gripMoved)
        );
    }

    if (columnSizes.size() > columns.size()) {
        view->setGeometry(0, 0, columnSizes.at(columns.size()), viewport->height());
    } else {
        int initialWidth = view->sizeHint().width();
        if (q->isRightToLeft())
            view->setGeometry(viewport->width() - initialWidth, 0, initialWidth, viewport->height());
        else
            view->setGeometry(0, 0, initialWidth, viewport->height());
        columnSizes.resize(qMax(columnSizes.size(), columns.size() + 1));
        columnSizes[columns.size()] = initialWidth;
    }
    if (!columns.isEmpty() && columns.constLast()->isHidden())
        columns.constLast()->setVisible(true);

    columns.append(view);
    doLayout();
    updateScrollbars();
    if (show && view->isHidden())
        view->setVisible(true);
    return view;
}